

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O1

Extra_MmStep_t * Extra_MmStepStart(int nSteps)

{
  int iVar1;
  Extra_MmStep_t *pEVar2;
  Extra_MmFixed_t **ppEVar3;
  Extra_MmFixed_t *pEVar4;
  Extra_MmFixed_t **ppEVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  pEVar2 = (Extra_MmStep_t *)malloc(0x30);
  *(undefined8 *)pEVar2 = 0;
  pEVar2->pMems = (Extra_MmFixed_t **)0x0;
  *(undefined8 *)&pEVar2->nMapSize = 0;
  pEVar2->pMap = (Extra_MmFixed_t **)0x0;
  pEVar2->nLargeChunksAlloc = 0;
  pEVar2->nLargeChunks = 0;
  pEVar2->pLargeChunks = (void **)0x0;
  pEVar2->nMems = nSteps;
  ppEVar3 = (Extra_MmFixed_t **)malloc((long)nSteps * 8);
  pEVar2->pMems = ppEVar3;
  if (0 < nSteps) {
    uVar8 = 0;
    do {
      pEVar4 = Extra_MmFixedStart(8 << ((byte)uVar8 & 0x1f));
      ppEVar3[uVar8] = pEVar4;
      uVar8 = uVar8 + 1;
    } while ((uint)nSteps != uVar8);
  }
  iVar1 = 4 << ((byte)nSteps & 0x1f);
  pEVar2->nMapSize = iVar1;
  ppEVar5 = (Extra_MmFixed_t **)malloc((long)(iVar1 + 1) << 3);
  pEVar2->pMap = ppEVar5;
  *ppEVar5 = (Extra_MmFixed_t *)0x0;
  pEVar4 = *ppEVar3;
  lVar6 = 0;
  do {
    ppEVar5[lVar6 + 1] = pEVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  if (0 < nSteps) {
    uVar8 = 0;
    do {
      iVar7 = 4 << ((byte)uVar8 & 0x1f);
      iVar1 = 8 << ((byte)uVar8 & 0x1f);
      if (iVar7 < iVar1) {
        pEVar4 = ppEVar3[uVar8];
        lVar6 = 0;
        do {
          ppEVar5[(long)iVar7 + lVar6 + 1] = pEVar4;
          lVar6 = lVar6 + 1;
        } while (iVar1 - iVar7 != (int)lVar6);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nSteps);
  }
  return pEVar2;
}

Assistant:

Extra_MmStep_t * Extra_MmStepStart( int nSteps )
{
    Extra_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Extra_MmStep_t, 1 );
    memset( p, 0, sizeof(Extra_MmStep_t) );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Extra_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Extra_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Extra_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    return p;
}